

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_pstore::json::error_code>
 __thiscall
pstore::json::details::string_matcher<pstore::json::null_output>::consume_escape_state
          (string_matcher<pstore::json::null_output> *this,char32_t code_point,appender *app)

{
  bool bVar1;
  state *__args_1;
  error_code local_64 [6];
  maybe<std::tuple<char32_t,_pstore::json::details::string_matcher<pstore::json::null_output>::state>,_void>
  local_4c;
  anon_class_8_1_ba1d3581 local_40;
  maybe<pstore::json::details::string_matcher<pstore::json::null_output>::state,_void> local_38;
  maybe<pstore::json::details::string_matcher<pstore::json::null_output>::state,_void> x;
  anon_class_8_1_ba1d3581 append;
  anon_class_1_0_00000001 decode;
  appender *app_local;
  char32_t code_point_local;
  
  local_40.app = app;
  x = (maybe<pstore::json::details::string_matcher<pstore::json::null_output>::state,_void>)app;
  consume_escape_state::anon_class_1_0_00000001::operator()
            (&local_4c,(anon_class_1_0_00000001 *)((long)&append.app + 7),code_point);
  pstore::operator>>=(&local_38,&local_4c,local_40);
  maybe<std::tuple<char32_t,_pstore::json::details::string_matcher<pstore::json::null_output>::state>,_void>
  ::~maybe(&local_4c);
  bVar1 = pstore::maybe::operator_cast_to_bool((maybe *)&local_38);
  if (bVar1) {
    __args_1 = maybe<pstore::json::details::string_matcher<pstore::json::null_output>::state,_void>
               ::operator*(&local_38);
    local_64[1] = 0;
    std::
    make_tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state_const&,pstore::json::error_code>
              ((state *)this,__args_1);
  }
  else {
    local_64[0] = expected_colon;
    std::
    make_tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,pstore::json::error_code>
              ((state *)this,local_64);
  }
  maybe<pstore::json::details::string_matcher<pstore::json::null_output>::state,_void>::~maybe
            (&local_38);
  return (tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_pstore::json::error_code>
          )(_Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::json::null_output>::state,_pstore::json::error_code>
            )this;
}

Assistant:

auto string_matcher<Callbacks>::consume_escape_state (char32_t code_point,
                                                                  appender & app)
                -> std::tuple<state, error_code> {

                auto decode = [] (char32_t cp) {
                    state next_state = normal_char_state;
                    switch (cp) {
                    case '"': cp = '"'; break;
                    case '\\': cp = '\\'; break;
                    case '/': cp = '/'; break;
                    case 'b': cp = '\b'; break;
                    case 'f': cp = '\f'; break;
                    case 'n': cp = '\n'; break;
                    case 'r': cp = '\r'; break;
                    case 't': cp = '\t'; break;
                    case 'u': next_state = hex1_state; break;
                    default: return nothing<std::tuple<char32_t, state>> ();
                    }
                    return just (std::make_tuple (cp, next_state));
                };

                auto append = [&app] (std::tuple<char32_t, state> const & s) {
                    char32_t const cp = std::get<0> (s);
                    state const next_state = std::get<1> (s);
                    PSTORE_ASSERT (next_state == normal_char_state || next_state == hex1_state);
                    if (next_state == normal_char_state) {
                        if (!app.append32 (cp)) {
                            return nothing<state> ();
                        }
                    }
                    return just (next_state);
                };

                maybe<state> const x = decode (code_point) >>= append;
                return x ? std::make_tuple (*x, error_code::none)
                         : std::make_tuple (normal_char_state, error_code::invalid_escape_char);
            }